

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEngine::initialize
          (QNativeSocketEngine *this,qintptr socketDescriptor,SocketState socketState)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  bool bVar2;
  
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this + 0xa8))(this);
  }
  this_00->socketDescriptor = socketDescriptor;
  bVar2 = QNativeSocketEnginePrivate::fetchConnectionParameters(this_00);
  if (bVar2) {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketType != UnknownSocketType) {
      cVar1 = (**(code **)(*(long *)this + 0x118))(this,0,1);
      if (cVar1 == '\0') {
        QNativeSocketEnginePrivate::setError
                  (this_00,UnsupportedSocketOperationError,NonBlockingInitFailedErrorString);
        (**(code **)(*(long *)this + 0xa8))(this);
        return false;
      }
      if (((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) &&
         (cVar1 = (**(code **)(*(long *)this + 0x118))(this,1,1), cVar1 == '\0')) {
        QNativeSocketEnginePrivate::setError
                  (this_00,UnsupportedSocketOperationError,BroadcastingInitFailedErrorString);
        (**(code **)(*(long *)this + 0xa8))(this);
        goto LAB_001c544c;
      }
    }
    (this_00->super_QAbstractSocketEnginePrivate).socketState = socketState;
    bVar2 = true;
  }
  else {
    this_00->socketDescriptor = -1;
LAB_001c544c:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QNativeSocketEngine::initialize(qintptr socketDescriptor, QAbstractSocket::SocketState socketState)
{
    Q_D(QNativeSocketEngine);

    if (isValid())
        close();

    d->socketDescriptor = socketDescriptor;

    // determine socket type and protocol
    if (!d->fetchConnectionParameters()) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug() << "QNativeSocketEngine::initialize(socketDescriptor) failed:"
                 << socketDescriptor << d->socketErrorString;
#endif
        d->socketDescriptor = -1;
        return false;
    }

    if (d->socketType != QAbstractSocket::UnknownSocketType) {
        // Make the socket nonblocking.
        if (!setOption(NonBlockingSocketOption, 1)) {
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                QNativeSocketEnginePrivate::NonBlockingInitFailedErrorString);
            close();
            return false;
        }

        // Set the broadcasting flag if it's a UDP socket.
        if (d->socketType == QAbstractSocket::UdpSocket
            && !setOption(BroadcastSocketOption, 1)) {
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                QNativeSocketEnginePrivate::BroadcastingInitFailedErrorString);
            close();
            return false;
        }
    }

    d->socketState = socketState;
    return true;
}